

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O2

void __thiscall Lodtalk::NativeError::NativeError(NativeError *this,string *errorMessage)

{
  this->super_NativeException = (NativeException)&PTR__NativeError_00170b08;
  std::__cxx11::string::string((string *)&this->errorMessage,(string *)errorMessage);
  return;
}

Assistant:

virtual const char* what() const noexcept
	{
		return errorMessage.c_str();
	}